

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void __thiscall ExpressionContext::PushScope(ExpressionContext *this,FunctionData *function)

{
  uint uVar1;
  ScopeData *pSVar2;
  ScopeData **ppSVar3;
  int iVar4;
  undefined4 extraout_var;
  ScopeData *this_00;
  
  iVar4 = (*this->allocator->_vptr_Allocator[2])(this->allocator,400);
  this_00 = (ScopeData *)CONCAT44(extraout_var,iVar4);
  uVar1 = this->uniqueScopeId;
  this->uniqueScopeId = uVar1 + 1;
  ScopeData::ScopeData(this_00,this->allocator,this->scope,uVar1,function);
  pSVar2 = this->scope;
  if (pSVar2 != (ScopeData *)0x0) {
    uVar1 = (pSVar2->scopes).count;
    if (uVar1 == (pSVar2->scopes).max) {
      SmallArray<ScopeData_*,_2U>::grow(&pSVar2->scopes,uVar1);
    }
    ppSVar3 = (pSVar2->scopes).data;
    if (ppSVar3 == (ScopeData **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<ScopeData *, 2>::push_back(const T &) [T = ScopeData *, N = 2]"
                   );
    }
    uVar1 = (pSVar2->scopes).count;
    (pSVar2->scopes).count = uVar1 + 1;
    ppSVar3[uVar1] = this_00;
  }
  this->scope = this_00;
  if (this->lookupLocation != (SynBase *)0x0) {
    this_00->unrestricted = true;
  }
  return;
}

Assistant:

void ExpressionContext::PushScope(FunctionData *function)
{
	ScopeData *next = new (get<ScopeData>()) ScopeData(allocator, scope, uniqueScopeId++, function);

	if(scope)
		scope->scopes.push_back(next);

	scope = next;

	if(lookupLocation)
		scope->unrestricted = true;
}